

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woz.cpp
# Opt level: O2

bool ReadWOZ(MemFile *file,shared_ptr<Disk> *disk)

{
  uint8_t *pb;
  element_type *peVar1;
  pointer __n;
  char extraout_AL;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  ssize_t sVar7;
  mapped_type *pmVar8;
  exception *peVar9;
  vector<char,_std::allocator<char>_> *in_RCX;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  CylHead str;
  pointer pcVar13;
  bool bVar14;
  uint32_t chunk_size;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  vector<char,_std::allocator<char>_> meta;
  WOZ_CHUNK wc;
  WOZ_HEADER wh;
  CylHead cylhead;
  CylHead local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  string str_meta;
  INFO_CHUNK_conflict info;
  undefined1 local_d3 [3];
  TMAP_CHUNK tmap;
  
  MemFile::rewind(file,(FILE *)disk);
  if ((extraout_AL != '\0') &&
     (sVar7 = MemFile::read(file,(int)&wh,(void *)0xc,(size_t)in_RCX), (char)sVar7 != '\0')) {
    if (wh.sig != (char  [4])0x315a4f57) {
      return false;
    }
    if (wh.ff != 0xff) {
      return false;
    }
    iVar2 = bcmp(wh.lfcrlf,"\n\r\n",3);
    if (iVar2 == 0) {
      uVar3 = util::le_value<4,_nullptr>(&wh.crc32);
      if (uVar3 != 0) {
        pbVar10 = (file->m_it)._M_current;
        iVar2 = MemFile::size(file);
        iVar4 = MemFile::tell(file);
        in_RCX = (vector<char,_std::allocator<char>_> *)(long)(iVar2 - iVar4);
        uVar5 = 0xffffffff;
        while (bVar14 = in_RCX != (vector<char,_std::allocator<char>_> *)0x0,
              in_RCX = (vector<char,_std::allocator<char>_> *)
                       ((long)&in_RCX[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7), bVar14) {
          uVar5 = uVar5 ^ *pbVar10;
          iVar2 = 8;
          while (bVar14 = iVar2 != 0, iVar2 = iVar2 + -1, bVar14) {
            uVar5 = -(uVar5 & 1) & 0xedb88320 ^ uVar5 >> 1;
          }
          pbVar10 = pbVar10 + 1;
        }
        if ((uVar5 ^ uVar3) != 0xffffffff) {
          Message<>(msgWarning,"file checksum is incorrect!");
        }
      }
      info.creator[0xb] = '\0';
      info.creator[0xc] = '\0';
      info.creator[0xd] = '\0';
      info.creator[0xe] = '\0';
      info.creator[0xf] = '\0';
      info.creator[0x10] = '\0';
      info.creator[0x11] = '\0';
      info.creator[0x12] = '\0';
      info.creator[0x13] = '\0';
      info.creator[0x14] = '\0';
      info.creator[0x15] = '\0';
      info.creator[0x16] = '\0';
      info.creator[0x17] = '\0';
      info.version = '\0';
      info.disk_type = '\0';
      info.write_protect = '\0';
      info.synchronised = '\0';
      info.cleaned = '\0';
      info.creator[0] = '\0';
      info.creator[1] = '\0';
      info.creator[2] = '\0';
      info.creator[3] = '\0';
      info.creator[4] = '\0';
      info.creator[5] = '\0';
      info.creator[6] = '\0';
      info.creator[7] = '\0';
      info.creator[8] = '\0';
      info.creator[9] = '\0';
      info.creator[10] = '\0';
      info.creator[0x18] = '\0';
      info.creator[0x19] = '\0';
      info.creator[0x1a] = '\0';
      info.creator[0x1b] = '\0';
      info.creator[0x1c] = '\0';
      info.creator[0x1d] = '\0';
      info.creator[0x1e] = '\0';
      info.creator[0x1f] = '\0';
      memset(&tmap,0,0xa0);
      wc.type[0] = '\0';
      wc.type[1] = '\0';
      wc.type[2] = '\0';
      wc.type[3] = '\0';
      wc.size[0] = '\0';
      wc.size[1] = '\0';
      wc.size[2] = '\0';
      wc.size[3] = '\0';
      do {
        sVar7 = MemFile::read(file,(int)&wc,(void *)0x8,(size_t)in_RCX);
        if ((char)sVar7 == '\0') {
          std::__cxx11::string::assign
                    ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                              ->strType);
          return true;
        }
        uVar6 = util::be_value<4,_nullptr>(wc.type);
        chunk_size = util::le_value<4,_nullptr>(&wc.size);
        iVar2 = MemFile::tell(file);
        uVar3 = chunk_size;
        if (uVar6 == 0x54524b53) {
          in_RCX = (vector<char,_std::allocator<char>_> *)0x1a00;
          __n = (pointer)((ulong)chunk_size / 0x1a00);
          if (chunk_size % 0x1a00 != 0) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[31]>
                      (peVar9,(char (*) [31])"TRKS chunk size is mis-aligned");
            goto LAB_001a2e9a;
          }
          std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::vector
                    ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)&meta,(size_type)__n,
                     (allocator_type *)&str_meta);
          lVar11 = 0;
          for (pcVar13 = (pointer)0x0; str_meta._M_dataplus._M_p = pcVar13, pcVar13 < __n;
              pcVar13 = pcVar13 + 1) {
            sVar7 = MemFile::read(file,(int)meta.super__Vector_base<char,_std::allocator<char>_>.
                                            _M_impl.super__Vector_impl_data._M_start + (int)lVar11,
                                  (void *)0x1a00,(size_t)in_RCX);
            if ((char)sVar7 == '\0') {
              peVar9 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[30]>
                        (peVar9,(char (*) [30])"short file reading track data");
LAB_001a2e32:
              __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            if (*(ushort *)
                 (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar11 + 0x19f8) + 7 >> 3 !=
                (uint)*(ushort *)
                       (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11 + 0x19f6)) {
              peVar9 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[39],unsigned_long&>
                        (peVar9,(char (*) [39])"bit/byte counts inconsistent on track ",
                         (unsigned_long *)&str_meta);
              goto LAB_001a2e32;
            }
            util::bit_reverse((uint8_t *)
                              (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar11),
                              (uint)*(ushort *)
                                     (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar11 + 0x19f6));
            lVar11 = lVar11 + 0x1a00;
          }
          bVar14 = info.disk_type == '\x01';
          for (uVar12 = 0; uVar12 < 0xa0; uVar12 = uVar12 + (ulong)bVar14 * 3 + 1) {
            in_RCX = (vector<char,_std::allocator<char>_> *)(ulong)tmap.map._M_elems[uVar12];
            if (in_RCX < (vector<char,_std::allocator<char>_> *)
                         (((long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x1a00)) {
              pb = (uint8_t *)
                   (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)in_RCX * 0x1a00);
              BitBuffer::BitBuffer
                        ((BitBuffer *)&str_meta,_250K,pb,
                         (uint)*(ushort *)
                                (meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + (long)in_RCX * 0x1a00 + 0x19f8))
              ;
              uVar5 = (uint)*(ushort *)(pb + 0x19fa);
              if (uVar5 != 0xffff) {
                BitBuffer::splicepos((BitBuffer *)&str_meta,uVar5);
              }
              in_RCX = (vector<char,_std::allocator<char>_> *)
                       (((long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x1a00);
              CylHead::CylHead(&cylhead,(uint)tmap.map._M_elems[uVar12],
                               (int)((uVar12 >> bVar14 * '\x02') / (ulong)in_RCX));
              Disk::write((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          (int)&cylhead,(BitBuffer *)&str_meta,(size_t)in_RCX);
              BitBuffer::~BitBuffer((BitBuffer *)&str_meta);
            }
          }
          std::_Vector_base<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::~_Vector_base
                    ((_Vector_base<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)&meta);
        }
        else if (uVar6 == 0x4d455441) {
          std::vector<char,_std::allocator<char>_>::vector
                    (&meta,(ulong)chunk_size,(allocator_type *)&str_meta);
          bVar14 = MemFile::read<std::vector<char,std::allocator<char>>>(file,&meta);
          if (!bVar14) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[30]>
                      (peVar9,(char (*) [30])"short file reading meta chunk");
            __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          str_meta._M_dataplus._M_p = (pointer)&str_meta.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&str_meta,
                     meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          in_RCX = (vector<char,_std::allocator<char>_> *)0x0;
          util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cylhead,&str_meta,'\n',false);
          for (str = cylhead; str != local_198; str = (CylHead)((long)str + 0x20)) {
            in_RCX = (vector<char,_std::allocator<char>_> *)0x0;
            util::split(&columns,(string *)str,'\t',false);
            if ((long)columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x40) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->metadata,
                                    columns.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              std::__cxx11::string::_M_assign((string *)pmVar8);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&columns);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cylhead);
          std::__cxx11::string::~string((string *)&str_meta);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&meta.super__Vector_base<char,_std::allocator<char>_>);
        }
        else if (uVar6 == 0x544d4150) {
          sVar7 = MemFile::read(file,(int)&tmap,(void *)0xa0,(size_t)in_RCX);
          if ((char)sVar7 == '\0') {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[29]>
                      (peVar9,(char (*) [29])"short file reading track map");
LAB_001a2e9a:
            __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if (uVar6 == 0x494e464f) {
          sVar7 = MemFile::read(file,(int)&info,(void *)0x25,(size_t)in_RCX);
          if ((char)sVar7 == '\0') {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[24]>
                      (peVar9,(char (*) [24])"short file reading info");
            goto LAB_001a2e9a;
          }
          if (info.disk_type == '\x01') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&str_meta,"5.25\"",&local_1e1);
          }
          else if (info.disk_type == '\x02') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&str_meta,"3.5\"",&local_1e2);
          }
          else {
            std::__cxx11::to_string(&str_meta,(uint)info.disk_type);
          }
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&meta,"disk_type",(allocator<char> *)&cylhead);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,(key_type *)&meta);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&str_meta);
          std::__cxx11::string::~string((string *)&meta);
          std::__cxx11::string::~string((string *)&str_meta);
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&str_meta,"read_only",(allocator<char> *)&meta);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,&str_meta);
          std::__cxx11::string::assign((char *)pmVar8);
          std::__cxx11::string::~string((string *)&str_meta);
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&str_meta,"synchronised",(allocator<char> *)&meta);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,&str_meta);
          std::__cxx11::string::assign((char *)pmVar8);
          std::__cxx11::string::~string((string *)&str_meta);
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&str_meta,"cleaned",(allocator<char> *)&meta);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,&str_meta);
          std::__cxx11::string::assign((char *)pmVar8);
          std::__cxx11::string::~string((string *)&str_meta);
          meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>((string *)&meta,info.creator,local_d3);
          util::trim(&str_meta,(string *)&meta);
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cylhead,"creator",(allocator<char> *)&columns);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar1->metadata,(key_type *)&cylhead);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&str_meta);
          std::__cxx11::string::~string((string *)&cylhead);
          std::__cxx11::string::~string((string *)&str_meta);
          std::__cxx11::string::~string((string *)&meta);
        }
        else {
          str_meta._M_dataplus._M_p = (pointer)0x4;
          in_RCX = &meta;
          meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&wc;
          Message<unsigned_long,char_const*,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_int&>
                    (msgWarning,"unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                     (unsigned_long *)&str_meta,(char **)in_RCX,wc.type,wc.type + 1,wc.type + 2,
                     wc.type + 3,&chunk_size);
          iVar4 = MemFile::tell(file);
          MemFile::seek(file,iVar4 + chunk_size);
        }
        MemFile::seek(file,uVar3 + iVar2);
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ReadWOZ(MemFile& file, std::shared_ptr<Disk>& disk)
{
    WOZ_HEADER wh;
    if (!file.rewind() || !file.read(&wh, sizeof(wh)) || memcmp(&wh.sig, WOZ_SIGNATURE, sizeof(wh.sig)))
        return false;
    else if (wh.ff != 0xff || memcmp(&wh.lfcrlf, "\n\r\n", 3))
        return false;

    auto crc = util::le_value(wh.crc32);
    if (crc && crc32(file.ptr<uint8_t>(), file.size() - file.tell()) != crc)
        Message(msgWarning, "file checksum is incorrect!");

    INFO_CHUNK info{};
    TMAP_CHUNK tmap{};
    WOZ_CHUNK wc{};

    while (file.read(&wc, sizeof(wc)))
    {
        auto chunk_id = util::be_value(wc.type);    // big-endian for text
        auto chunk_size = util::le_value(wc.size);
        auto next_pos = file.tell() + chunk_size;

        switch (chunk_id)
        {
        case id_value("INFO"):
        {
            if (!file.read(&info, sizeof(info)))
                throw util::exception("short file reading info");

            disk->metadata["disk_type"] = (info.disk_type == 1) ? "5.25\"" :
                (info.disk_type == 2) ? "3.5\"" : std::to_string(info.disk_type);
            disk->metadata["read_only"] = info.write_protect ? "yes" : "no";
            disk->metadata["synchronised"] = info.synchronised ? "yes" : "no";
            disk->metadata["cleaned"] = info.cleaned ? "yes" : "no";
            disk->metadata["creator"] =
                util::trim(std::string(info.creator, sizeof(info.creator)));
            break;
        }

        case id_value("TMAP"):
            if (!file.read(&tmap, sizeof(tmap)))
                throw util::exception("short file reading track map");
            break;

        case id_value("TRKS"):
        {
            if (chunk_size % sizeof(TRKS_CHUNK))
                throw util::exception("TRKS chunk size is mis-aligned");

            auto tracks = chunk_size / sizeof(TRKS_CHUNK);
            std::vector<TRKS_CHUNK> trks(tracks);

            for (size_t i = 0; i < tracks; ++i)
            {
                if (!file.read(&trks[i], sizeof(trks[i])))
                    throw util::exception("short file reading track data");
                else if (util::le_value(trks[i].used_bytes) !=
                    (util::le_value(trks[i].used_bits) + 7) / 8)
                    throw util::exception("bit/byte counts inconsistent on track ", i);

                util::bit_reverse(trks[i].data, util::le_value(trks[i].used_bytes));
            }

            int cyl_step = (info.disk_type == 1) ? 4 : 1;
            for (size_t i = 0; i < tmap.map.size(); i += cyl_step)
            {
                if (tmap.map[i] < trks.size())
                {
                    auto& trk = trks[tmap.map[i]];
                    BitBuffer bitbuf(DataRate::_250K, trk.data, util::le_value(trk.used_bits));

                    auto splicepos = util::le_value(trk.splice_pos);
                    if (splicepos != 0xffff)
                        bitbuf.splicepos(splicepos);

                    auto cylhead = CylHead(tmap.map[i], static_cast<int>((i / cyl_step) / trks.size()));
                    disk->write(cylhead, std::move(bitbuf));
                }
            }
            break;
        }

        case id_value("META"):
        {
            std::vector<char> meta(chunk_size);
            if (!file.read(meta))
                throw util::exception("short file reading meta chunk");

            auto str_meta = std::string(meta.data(), meta.size());
            for (auto& row : util::split(str_meta, '\n'))
            {
                auto columns = util::split(row, '\t');
                if (columns.size() == 2)
                    disk->metadata[columns[0]] = columns[1];
            }
            break;
        }

        default:
            Message(msgWarning, "unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                sizeof(wc.type), reinterpret_cast<const char*>(wc.type),
                wc.type[0], wc.type[1], wc.type[2], wc.type[3], chunk_size);

            file.seek(file.tell() + chunk_size);
            break;
        }

        file.seek(next_pos);
    }

    disk->strType = "WOZ";
    return true;
}